

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  pointer ppVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_14;
  ostream *output_stream_1;
  ostringstream error_message_13;
  ofstream ofs_1;
  ostringstream error_message_12;
  iterator itr_1;
  ostream *output_stream;
  ostringstream error_message_11;
  ofstream ofs;
  ostringstream error_message_10;
  iterator itr;
  ostringstream error_message_9;
  double total_score;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> viterbi_path;
  ostringstream error_message_8;
  DynamicTimeWarping dynamic_time_warping;
  vector<double,_std::allocator<double>_> tmp_3;
  istream *input_stream_1;
  ostringstream error_message_7;
  ifstream ifs_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  query_vectors;
  vector<double,_std::allocator<double>_> tmp_2;
  istream *input_stream;
  ostringstream error_message_6;
  ifstream ifs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  reference_vectors;
  int length;
  ostringstream error_message_5;
  ostringstream error_message_4;
  int num_input_files;
  char *query_file;
  char *reference_file;
  ostringstream error_message_3;
  int tmp_1;
  int max_1;
  int min_1;
  ostringstream error_message_2;
  int tmp;
  int max;
  int min;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  char *viterbi_path_file;
  char *total_score_file;
  DistanceMetrics distance_metric;
  LocalPathConstraints local_path_constraint;
  int num_order;
  option *in_stack_ffffffffffffdb08;
  DynamicTimeWarping *in_stack_ffffffffffffdb10;
  undefined7 in_stack_ffffffffffffdb18;
  undefined1 in_stack_ffffffffffffdb1f;
  allocator *in_stack_ffffffffffffdb20;
  size_type in_stack_ffffffffffffdb28;
  undefined7 in_stack_ffffffffffffdb30;
  undefined1 in_stack_ffffffffffffdb37;
  undefined4 in_stack_ffffffffffffdb40;
  undefined4 in_stack_ffffffffffffdb44;
  istream *in_stack_ffffffffffffdb48;
  allocator *paVar5;
  undefined6 in_stack_ffffffffffffdb50;
  undefined1 in_stack_ffffffffffffdb56;
  undefined1 in_stack_ffffffffffffdb57;
  undefined8 in_stack_ffffffffffffdb58;
  undefined8 in_stack_ffffffffffffdb60;
  int *in_stack_ffffffffffffdb70;
  char *pcVar6;
  char *local_2430;
  DistanceMetrics in_stack_ffffffffffffdc04;
  long in_stack_ffffffffffffdc08;
  DynamicTimeWarping *in_stack_ffffffffffffdc10;
  byte local_236a;
  double *in_stack_ffffffffffffdcc8;
  ostringstream *poVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffdcd0;
  undefined4 in_stack_ffffffffffffdcd8;
  byte in_stack_ffffffffffffdcdc;
  undefined1 in_stack_ffffffffffffdcdd;
  byte in_stack_ffffffffffffdcde;
  undefined1 in_stack_ffffffffffffdcdf;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffdce0;
  DynamicTimeWarping *in_stack_ffffffffffffdce8;
  ostringstream *in_stack_ffffffffffffdcf8;
  string *in_stack_ffffffffffffdd00;
  bool local_22f2;
  bool local_22ca;
  undefined1 local_22a9 [33];
  ostringstream local_2288 [376];
  char *local_2110;
  allocator local_2101;
  string local_2100 [32];
  ostringstream local_20e0 [376];
  char local_1f68 [519];
  allocator local_1d61;
  string local_1d60 [32];
  ostringstream local_1d40 [376];
  pair<int,_int> *local_1bc8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_1bc0;
  char *local_1bb8;
  allocator local_1ba9;
  string local_1ba8 [32];
  ostringstream local_1b88 [376];
  char local_1a10 [519];
  allocator local_1809;
  string local_1808 [32];
  ostringstream local_17e8 [376];
  pair<int,_int> *local_1670;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_1668;
  allocator local_1659;
  string local_1658 [32];
  ostringstream local_1638 [415];
  allocator local_1499;
  string local_1498 [32];
  ostringstream local_1478 [376];
  DynamicTimeWarping local_1300;
  char *local_1280;
  allocator local_1271;
  string local_1270 [32];
  ostringstream local_1250 [376];
  char local_10d8 [520];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_ed0;
  undefined1 local_eb1 [33];
  int local_e90;
  allocator local_e89;
  string local_e88 [32];
  ostringstream local_e68 [376];
  char local_cf0 [520];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_ae8;
  int local_ad0;
  allocator local_ac9;
  string local_ac8 [32];
  ostringstream local_aa8 [383];
  allocator local_929;
  string local_928 [32];
  ostringstream local_908 [380];
  int local_78c;
  char *local_788;
  char *local_780;
  allocator local_771;
  string local_770 [32];
  ostringstream local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  int local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  allocator local_5a1;
  string local_5a0 [32];
  ostringstream local_580 [383];
  undefined1 local_401 [33];
  int local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  allocator local_3d1;
  string local_3d0 [32];
  ostringstream local_3b0 [383];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  ostringstream local_1e8 [399];
  allocator local_59;
  string local_58 [36];
  int local_34;
  char *local_30;
  char *local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 4;
  local_1c = 1;
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_34 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffdb20 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffdb1f,
                                                     in_stack_ffffffffffffdb18),
                                   (char *)in_stack_ffffffffffffdb10,in_stack_ffffffffffffdb08,
                                   (int *)0x10379d), pcVar6 = ya_optarg, local_34 != -1) {
    switch(local_34) {
    case 0x50:
      local_30 = ya_optarg;
      break;
    default:
      anon_unknown.dwarf_341c::PrintUsage
                ((ostream *)
                 CONCAT17(in_stack_ffffffffffffdb57,
                          CONCAT16(in_stack_ffffffffffffdb56,in_stack_ffffffffffffdb50)));
      return 1;
    case 0x53:
      local_28 = ya_optarg;
      break;
    case 100:
      local_5a8 = 0;
      local_5ac = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d0,pcVar6,&local_5d1);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffdb1f,in_stack_ffffffffffffdb18),
                         (int *)in_stack_ffffffffffffdb10);
      local_236a = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_5b0,0,3);
        local_236a = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      if ((local_236a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_750);
        poVar4 = std::operator<<((ostream *)local_750,
                                 "The argument for the -d option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_770,"dtw",&local_771);
        sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
        std::__cxx11::string::~string(local_770);
        std::allocator<char>::~allocator((allocator<char> *)&local_771);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_750);
        return local_4;
      }
      local_1c = local_5b0;
      break;
    case 0x68:
      anon_unknown.dwarf_341c::PrintUsage
                ((ostream *)
                 CONCAT17(in_stack_ffffffffffffdb57,
                          CONCAT16(in_stack_ffffffffffffdb56,in_stack_ffffffffffffdb50)));
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar6,&local_59);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffdb1f,in_stack_ffffffffffffdb18),
                         (int *)in_stack_ffffffffffffdb10);
      local_22ca = !bVar1 || local_14 < 1;
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      if (local_22ca) {
        std::__cxx11::ostringstream::ostringstream(local_1e8);
        std::operator<<((ostream *)local_1e8,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"dtw",&local_209);
        sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e8);
        return local_4;
      }
      local_14 = local_14 + -1;
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,pcVar6,&local_231);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffdb1f,in_stack_ffffffffffffdb18),
                         (int *)in_stack_ffffffffffffdb10);
      local_22f2 = !bVar1 || local_14 < 0;
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      if (local_22f2) {
        poVar7 = local_3b0;
        std::__cxx11::ostringstream::ostringstream(poVar7);
        poVar4 = std::operator<<((ostream *)poVar7,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3d0,"dtw",&local_3d1);
        sptk::PrintErrorMessage((string *)poVar4,(ostringstream *)poVar7);
        std::__cxx11::string::~string(local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3b0);
        return local_4;
      }
      break;
    case 0x70:
      local_3d8._0_1_ = false;
      local_3d8._1_3_ = 0;
      local_3dc._0_3_ = 6;
      local_3dc._3_1_ = false;
      in_stack_ffffffffffffdce8 = (DynamicTimeWarping *)local_401;
      in_stack_ffffffffffffdce0 =
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_401 + 1),(char *)in_stack_ffffffffffffdce0,
                 (allocator *)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdcdf =
           sptk::ConvertStringToInteger
                     ((string *)CONCAT17(in_stack_ffffffffffffdb1f,in_stack_ffffffffffffdb18),
                      (int *)in_stack_ffffffffffffdb10);
      in_stack_ffffffffffffdcdc = 1;
      if ((bool)in_stack_ffffffffffffdcdf) {
        in_stack_ffffffffffffdcdd = sptk::IsInRange(local_3e0,0,6);
        in_stack_ffffffffffffdcdc = in_stack_ffffffffffffdcdd ^ 0xff;
      }
      in_stack_ffffffffffffdcde = in_stack_ffffffffffffdcdc;
      std::__cxx11::string::~string((string *)(local_401 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_401);
      if ((in_stack_ffffffffffffdcdc & 1) != 0) {
        poVar7 = local_580;
        std::__cxx11::ostringstream::ostringstream(poVar7);
        poVar4 = std::operator<<((ostream *)poVar7,
                                 "The argument for the -p option must be an integer ");
        poVar4 = std::operator<<(poVar4,"in the range of ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
        poVar4 = std::operator<<(poVar4," to ");
        std::ostream::operator<<(poVar4,6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a0,"dtw",&local_5a1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
        std::__cxx11::string::~string(local_5a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_580);
        return local_4;
      }
      local_18 = local_3e0;
    }
  }
  local_78c = local_8 - ya_optind;
  if (local_78c == 2) {
    local_780 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_788 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_78c != 1) {
      std::__cxx11::ostringstream::ostringstream(local_908);
      std::operator<<((ostream *)local_908,"Just two input files, file1 and infile, are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_928,"dtw",&local_929);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
      std::__cxx11::string::~string(local_928);
      std::allocator<char>::~allocator((allocator<char> *)&local_929);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_908);
      return local_4;
    }
    local_780 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_788 = (char *)0x0;
  }
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_aa8);
    std::operator<<((ostream *)local_aa8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ac8,"dtw",&local_ac9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
    std::__cxx11::string::~string(local_ac8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_aa8);
    return local_4;
  }
  local_ad0 = local_14 + 1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x10458f);
  std::ifstream::ifstream(local_cf0);
  pcVar6 = local_780;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_cf0,(_Ios_Openmode)pcVar6);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) == 0) {
    local_eb1._25_8_ = local_cf0;
    in_stack_ffffffffffffdc08 = (long)local_ad0;
    in_stack_ffffffffffffdc10 = (DynamicTimeWarping *)local_eb1;
    std::allocator<double>::allocator((allocator<double> *)0x1047b9);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffdb37,in_stack_ffffffffffffdb30),
               in_stack_ffffffffffffdb28,(allocator_type *)in_stack_ffffffffffffdb20);
    std::allocator<double>::~allocator((allocator<double> *)0x1047e5);
    while( true ) {
      in_stack_ffffffffffffdb08 = (option *)0x0;
      bVar1 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffdb60 >> 0x30,0),
                         (int)in_stack_ffffffffffffdb60,
                         (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20),
                         (int)in_stack_ffffffffffffdb58,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffdb57,
                                  CONCAT16(in_stack_ffffffffffffdb56,in_stack_ffffffffffffdb50)),
                         in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb70);
      in_stack_ffffffffffffdc04 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffdc04);
      if (!bVar1) break;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_ffffffffffffdb20,
                  (value_type *)CONCAT17(in_stack_ffffffffffffdb1f,in_stack_ffffffffffffdb18));
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb20);
    local_e90 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e68);
    poVar4 = std::operator<<((ostream *)local_e68,"Cannot open file ");
    std::operator<<(poVar4,local_780);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e88,"dtw",&local_e89);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
    std::__cxx11::string::~string(local_e88);
    std::allocator<char>::~allocator((allocator<char> *)&local_e89);
    local_4 = 1;
    local_e90 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e68);
  }
  std::ifstream::~ifstream(local_cf0);
  if (local_e90 != 0) goto LAB_00105968;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1048cf);
  std::ifstream::ifstream(local_10d8);
  pcVar6 = local_788;
  if (local_788 == (char *)0x0) {
LAB_00104ae8:
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      local_2430 = (char *)&std::cin;
    }
    else {
      local_2430 = local_10d8;
    }
    local_1280 = local_2430;
    std::allocator<double>::allocator((allocator<double> *)0x104b63);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffdb37,in_stack_ffffffffffffdb30),
               in_stack_ffffffffffffdb28,(allocator_type *)in_stack_ffffffffffffdb20);
    std::allocator<double>::~allocator((allocator<double> *)0x104b8f);
    while( true ) {
      in_stack_ffffffffffffdb08 = (option *)0x0;
      bVar1 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffdb60 >> 0x30,0),
                         (int)in_stack_ffffffffffffdb60,
                         (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20),
                         (int)in_stack_ffffffffffffdb58,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffdb57,
                                  CONCAT16(in_stack_ffffffffffffdb56,in_stack_ffffffffffffdb50)),
                         in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb70);
      if (!bVar1) break;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_ffffffffffffdb20,
                  (value_type *)CONCAT17(in_stack_ffffffffffffdb1f,in_stack_ffffffffffffdb18));
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdb20);
    local_e90 = 0;
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_10d8,(_Ios_Openmode)pcVar6);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) == 0) goto LAB_00104ae8;
    std::__cxx11::ostringstream::ostringstream(local_1250);
    poVar4 = std::operator<<((ostream *)local_1250,"Cannot open file ");
    std::operator<<(poVar4,local_788);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1270,"dtw",&local_1271);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
    std::__cxx11::string::~string(local_1270);
    std::allocator<char>::~allocator((allocator<char> *)&local_1271);
    local_4 = 1;
    local_e90 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1250);
  }
  std::ifstream::~ifstream(local_10d8);
  if (local_e90 == 0) {
    sptk::DynamicTimeWarping::DynamicTimeWarping
              (in_stack_ffffffffffffdc10,(int)((ulong)in_stack_ffffffffffffdc08 >> 0x20),
               (LocalPathConstraints)in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc04);
    bVar1 = sptk::DynamicTimeWarping::IsValid(&local_1300);
    if (bVar1) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x104e14);
      bVar1 = sptk::DynamicTimeWarping::Run
                        (in_stack_ffffffffffffdce8,in_stack_ffffffffffffdce0,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffdcdf,
                                     CONCAT16(in_stack_ffffffffffffdcde,
                                              CONCAT15(in_stack_ffffffffffffdcdd,
                                                       CONCAT14(in_stack_ffffffffffffdcdc,
                                                                in_stack_ffffffffffffdcd8)))),
                         in_stack_ffffffffffffdcd0,in_stack_ffffffffffffdcc8);
      if (bVar1) {
        local_1668._M_current =
             (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        in_stack_ffffffffffffdb08);
        while( true ) {
          local_1670 = (pair<int,_int> *)
                       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)in_stack_ffffffffffffdb08);
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)in_stack_ffffffffffffdb10,
                             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)in_stack_ffffffffffffdb08);
          if (!bVar1) break;
          ppVar3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator->(&local_1668);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[](&local_ed0,(long)ppVar3->first);
          bVar1 = sptk::WriteStream<double>
                            ((int)in_stack_ffffffffffffdb60,
                             (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20),
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT17(in_stack_ffffffffffffdb57,
                                      CONCAT16(in_stack_ffffffffffffdb56,in_stack_ffffffffffffdb50))
                             ,(ostream *)in_stack_ffffffffffffdb48,
                             (int *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40));
          if (!bVar1) {
LAB_00105096:
            std::__cxx11::ostringstream::ostringstream(local_17e8);
            std::operator<<((ostream *)local_17e8,"Failed to write warped vector");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1808,"dtw",&local_1809);
            sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
            std::__cxx11::string::~string(local_1808);
            std::allocator<char>::~allocator((allocator<char> *)&local_1809);
            local_4 = 1;
            local_e90 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_17e8);
            goto LAB_0010590e;
          }
          ppVar3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator->(&local_1668);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[](&local_ae8,(long)ppVar3->second);
          bVar1 = sptk::WriteStream<double>
                            ((int)in_stack_ffffffffffffdb60,
                             (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20),
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT17(in_stack_ffffffffffffdb57,
                                      CONCAT16(in_stack_ffffffffffffdb56,in_stack_ffffffffffffdb50))
                             ,(ostream *)in_stack_ffffffffffffdb48,
                             (int *)CONCAT44(in_stack_ffffffffffffdb44,in_stack_ffffffffffffdb40));
          if (!bVar1) goto LAB_00105096;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_1668);
        }
        if (local_30 != (char *)0x0) {
          std::ofstream::ofstream(local_1a10);
          pcVar6 = local_30;
          std::operator|(_S_out,_S_bin);
          std::ofstream::open(local_1a10,(_Ios_Openmode)pcVar6);
          bVar2 = std::ios::fail();
          if ((bVar2 & 1) == 0) {
            local_1bb8 = local_1a10;
            local_1bc0._M_current =
                 (pair<int,_int> *)
                 std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            in_stack_ffffffffffffdb08);
            while( true ) {
              local_1bc8 = (pair<int,_int> *)
                           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                           end((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )in_stack_ffffffffffffdb08);
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                  *)in_stack_ffffffffffffdb10,
                                 (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                  *)in_stack_ffffffffffffdb08);
              if (!bVar1) break;
              __gnu_cxx::
              __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::operator->(&local_1bc0);
              bVar1 = sptk::WriteStream<int>
                                ((int)in_stack_ffffffffffffdb10,(ostream *)in_stack_ffffffffffffdb08
                                );
              if (!bVar1) {
LAB_00105444:
                std::__cxx11::ostringstream::ostringstream(local_1d40);
                std::operator<<((ostream *)local_1d40,"Failed to write Viterbi path");
                paVar5 = &local_1d61;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1d60,"dtw",paVar5);
                sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
                std::__cxx11::string::~string(local_1d60);
                std::allocator<char>::~allocator((allocator<char> *)&local_1d61);
                local_4 = 1;
                local_e90 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_1d40);
                goto LAB_00105577;
              }
              __gnu_cxx::
              __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::operator->(&local_1bc0);
              bVar1 = sptk::WriteStream<int>
                                ((int)in_stack_ffffffffffffdb10,(ostream *)in_stack_ffffffffffffdb08
                                );
              if (!bVar1) goto LAB_00105444;
              __gnu_cxx::
              __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::operator++(&local_1bc0);
            }
            local_e90 = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_1b88);
            poVar4 = std::operator<<((ostream *)local_1b88,"Cannot open file ");
            std::operator<<(poVar4,local_30);
            paVar5 = &local_1ba9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1ba8,"dtw",paVar5);
            sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
            std::__cxx11::string::~string(local_1ba8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1ba9);
            local_4 = 1;
            local_e90 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1b88);
          }
LAB_00105577:
          std::ofstream::~ofstream(local_1a10);
          if (local_e90 != 0) goto LAB_0010590e;
        }
        if (local_28 != (char *)0x0) {
          std::ofstream::ofstream(local_1f68);
          pcVar6 = local_28;
          std::operator|(_S_out,_S_bin);
          std::ofstream::open(local_1f68,(_Ios_Openmode)pcVar6);
          bVar2 = std::ios::fail();
          if ((bVar2 & 1) == 0) {
            local_2110 = local_1f68;
            bVar1 = sptk::WriteStream<double>((double)in_stack_ffffffffffffdb08,(ostream *)0x10579d)
            ;
            if (bVar1) {
              local_e90 = 0;
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_2288);
              std::operator<<((ostream *)local_2288,"Failed to write total score");
              in_stack_ffffffffffffdb10 = (DynamicTimeWarping *)local_22a9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_22a9 + 1),"dtw",(allocator *)in_stack_ffffffffffffdb10);
              sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
              std::__cxx11::string::~string((string *)(local_22a9 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_22a9);
              local_4 = 1;
              local_e90 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2288);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_20e0);
            poVar4 = std::operator<<((ostream *)local_20e0,"Cannot open file ");
            std::operator<<(poVar4,local_28);
            in_stack_ffffffffffffdb20 = &local_2101;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2100,"dtw",in_stack_ffffffffffffdb20);
            sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
            std::__cxx11::string::~string(local_2100);
            std::allocator<char>::~allocator((allocator<char> *)&local_2101);
            local_4 = 1;
            local_e90 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_20e0);
          }
          std::ofstream::~ofstream(local_1f68);
          if (local_e90 != 0) goto LAB_0010590e;
        }
        local_4 = 0;
        local_e90 = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1638);
        std::operator<<((ostream *)local_1638,"Failed to perform dynamic time warping");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1658,"dtw",&local_1659);
        sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
        std::__cxx11::string::~string(local_1658);
        std::allocator<char>::~allocator((allocator<char> *)&local_1659);
        local_4 = 1;
        local_e90 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1638);
      }
LAB_0010590e:
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_ffffffffffffdb20);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1478);
      std::operator<<((ostream *)local_1478,"Failed to initialize DynamicTimeWarping");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1498,"dtw",&local_1499);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdd00,in_stack_ffffffffffffdcf8);
      std::__cxx11::string::~string(local_1498);
      std::allocator<char>::~allocator((allocator<char> *)&local_1499);
      local_4 = 1;
      local_e90 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1478);
    }
    sptk::DynamicTimeWarping::~DynamicTimeWarping(in_stack_ffffffffffffdb10);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffdb20);
LAB_00105968:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffdb20);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  sptk::DynamicTimeWarping::LocalPathConstraints local_path_constraint(
      kDefaultLocalPathConstraint);
  sptk::DistanceCalculation::DistanceMetrics distance_metric(
      kDefaultDistanceMetric);
  const char* total_score_file(NULL);
  const char* viterbi_path_file(NULL);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:d:P:S:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DynamicTimeWarping::LocalPathConstraints::kNumTypes) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -p option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        local_path_constraint =
            static_cast<sptk::DynamicTimeWarping::LocalPathConstraints>(tmp);
        break;
      }
      case 'd': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::DistanceCalculation::DistanceMetrics::kNumMetrics) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -d option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dtw", error_message);
          return 1;
        }
        distance_metric =
            static_cast<sptk::DistanceCalculation::DistanceMetrics>(tmp);
        break;
      }
      case 'P': {
        viterbi_path_file = optarg;
        break;
      }
      case 'S': {
        total_score_file = optarg;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, file1 and infile, are required";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }
  const int length(num_order + 1);

  std::vector<std::vector<double> > reference_vectors;
  {
    std::ifstream ifs;
    ifs.open(reference_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << reference_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      reference_vectors.push_back(tmp);
    }
  }

  std::vector<std::vector<double> > query_vectors;
  {
    std::ifstream ifs;
    if (NULL != query_file) {
      ifs.open(query_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << query_file;
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      query_vectors.push_back(tmp);
    }
  }

  sptk::DynamicTimeWarping dynamic_time_warping(
      num_order, local_path_constraint, distance_metric);
  if (!dynamic_time_warping.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize DynamicTimeWarping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  std::vector<std::pair<int, int> > viterbi_path;
  double total_score;
  if (!dynamic_time_warping.Run(query_vectors, reference_vectors, &viterbi_path,
                                &total_score)) {
    std::ostringstream error_message;
    error_message << "Failed to perform dynamic time warping";
    sptk::PrintErrorMessage("dtw", error_message);
    return 1;
  }

  for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
       itr != viterbi_path.end(); ++itr) {
    if (!sptk::WriteStream(0, length, query_vectors[itr->first], &std::cout,
                           NULL) ||
        !sptk::WriteStream(0, length, reference_vectors[itr->second],
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write warped vector";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  if (NULL != viterbi_path_file) {
    std::ofstream ofs;
    ofs.open(viterbi_path_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << viterbi_path_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    for (std::vector<std::pair<int, int> >::iterator itr(viterbi_path.begin());
         itr != viterbi_path.end(); ++itr) {
      if (!sptk::WriteStream(itr->first, &output_stream) ||
          !sptk::WriteStream(itr->second, &output_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to write Viterbi path";
        sptk::PrintErrorMessage("dtw", error_message);
        return 1;
      }
    }
  }

  if (NULL != total_score_file) {
    std::ofstream ofs;
    ofs.open(total_score_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << total_score_file;
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(total_score, &output_stream)) {
      std::ostringstream error_message;
      error_message << "Failed to write total score";
      sptk::PrintErrorMessage("dtw", error_message);
      return 1;
    }
  }

  return 0;
}